

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O3

FileName * embree::FileName::executableFolder(void)

{
  FileName *in_RDI;
  FileName local_50;
  string local_30;
  
  getExecutableFileName_abi_cxx11_();
  FileName(&local_50,&local_30);
  path(in_RDI,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.filename._M_dataplus._M_p != &local_50.filename.field_2) {
    operator_delete(local_50.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return in_RDI;
}

Assistant:

FileName FileName::executableFolder() {
    return FileName(getExecutableFileName()).path();
  }